

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O1

void __thiscall
ContainerAlgorithms::
DefaultDeleter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>_>,_true>
::operator()(DefaultDeleter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>_>,_true>
             *this,value_type *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmDependInformation *this_00;
  pointer pcVar2;
  
  this_00 = value->second;
  if (this_00 != (cmDependInformation *)0x0) {
    pcVar2 = (this_00->IncludeName)._M_dataplus._M_p;
    paVar1 = &(this_00->IncludeName).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    pcVar2 = (this_00->PathOnly)._M_dataplus._M_p;
    paVar1 = &(this_00->PathOnly).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    pcVar2 = (this_00->FullPath)._M_dataplus._M_p;
    paVar1 = &(this_00->FullPath).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<cmDependInformation_*,_cmDependInformation_*,_std::_Identity<cmDependInformation_*>,_std::less<cmDependInformation_*>,_std::allocator<cmDependInformation_*>_>
    ::~_Rb_tree((_Rb_tree<cmDependInformation_*,_cmDependInformation_*,_std::_Identity<cmDependInformation_*>,_std::less<cmDependInformation_*>,_std::allocator<cmDependInformation_*>_>
                 *)this_00);
    operator_delete(this_00,0xa0);
    return;
  }
  return;
}

Assistant:

void operator()(typename Range::value_type value) const {
    delete value.second;
  }